

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

Array<capnp::Schema> * __thiscall
capnp::SchemaLoader::Impl::getAllLoaded(Array<capnp::Schema> *__return_storage_ptr__,Impl *this)

{
  HashMap<unsigned_long,_capnp::_::RawSchema_*> *index;
  Schema *pSVar1;
  Schema local_88;
  Entry *local_80;
  Entry *schema_1;
  Entry *__end1_1;
  Entry *local_60;
  Entry *__begin1_1;
  HashMap<unsigned_long,_capnp::_::RawSchema_*> *__range1_1;
  size_t i;
  Entry *local_40;
  Entry *schema;
  Entry *__end1;
  Entry *__begin1;
  HashMap<unsigned_long,_capnp::_::RawSchema_*> *__range1;
  size_t count;
  Impl *this_local;
  Array<capnp::Schema> *result;
  
  __range1 = (HashMap<unsigned_long,_capnp::_::RawSchema_*> *)0x0;
  __begin1 = (Entry *)&this->schemas;
  count = (size_t)this;
  this_local = (Impl *)__return_storage_ptr__;
  __end1 = kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::begin
                     ((HashMap<unsigned_long,_capnp::_::RawSchema_*> *)__begin1);
  schema = kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::end
                     ((HashMap<unsigned_long,_capnp::_::RawSchema_*> *)__begin1);
  for (; __end1 != schema; __end1 = __end1 + 1) {
    local_40 = __end1;
    if (__end1->value->lazyInitializer == (Initializer *)0x0) {
      __range1 = (HashMap<unsigned_long,_capnp::_::RawSchema_*> *)
                 ((long)&(__range1->table).rows.builder.ptr + 1);
    }
  }
  i._7_1_ = 0;
  kj::heapArray<capnp::Schema>(__return_storage_ptr__,(size_t)__range1);
  __range1_1 = (HashMap<unsigned_long,_capnp::_::RawSchema_*> *)0x0;
  __begin1_1 = (Entry *)&this->schemas;
  local_60 = kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::begin
                       ((HashMap<unsigned_long,_capnp::_::RawSchema_*> *)__begin1_1);
  schema_1 = kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::end
                       ((HashMap<unsigned_long,_capnp::_::RawSchema_*> *)__begin1_1);
  for (; local_60 != schema_1; local_60 = local_60 + 1) {
    local_80 = local_60;
    if (local_60->value->lazyInitializer == (Initializer *)0x0) {
      Schema::Schema(&local_88,&local_60->value->defaultBrand);
      index = __range1_1;
      __range1_1 = (HashMap<unsigned_long,_capnp::_::RawSchema_*> *)
                   ((long)&(__range1_1->table).rows.builder.ptr + 1);
      pSVar1 = kj::Array<capnp::Schema>::operator[](__return_storage_ptr__,(size_t)index);
      pSVar1->raw = local_88.raw;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Array<Schema> SchemaLoader::Impl::getAllLoaded() const {
  size_t count = 0;
  for (auto& schema: schemas) {
    if (schema.value->lazyInitializer == nullptr) ++count;
  }

  kj::Array<Schema> result = kj::heapArray<Schema>(count);
  size_t i = 0;
  for (auto& schema: schemas) {
    if (schema.value->lazyInitializer == nullptr) {
      result[i++] = Schema(&schema.value->defaultBrand);
    }
  }
  return result;
}